

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::IsInitializedImpl
               (MessageLite *msg)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = *(uint *)&msg[1]._vptr_MessageLite;
  if ((uVar2 & 1) == 0) {
LAB_00213b73:
    if ((uVar2 & 2) != 0) {
      bVar1 = FeatureSet::IsInitializedImpl((MessageLite *)msg[2]._vptr_MessageLite);
      if (!bVar1) goto LAB_00213b88;
    }
    bVar1 = true;
  }
  else {
    bVar1 = FeatureSet::IsInitializedImpl((MessageLite *)msg[1]._internal_metadata_.ptr_);
    if (bVar1) {
      uVar2 = *(uint *)&msg[1]._vptr_MessageLite;
      goto LAB_00213b73;
    }
LAB_00213b88:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

PROTOBUF_NOINLINE bool FeatureSetDefaults_FeatureSetEditionDefault::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const FeatureSetDefaults_FeatureSetEditionDefault&>(msg);
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (!this_._impl_.overridable_features_->IsInitialized()) return false;
  }
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._impl_.fixed_features_->IsInitialized()) return false;
  }
  return true;
}